

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O1

int doopen(int dx,int dy,int dz)

{
  uint uVar1;
  monst *pmVar2;
  char cVar3;
  boolean bVar4;
  int iVar5;
  undefined8 in_RAX;
  monst *mtmp;
  obj *pick;
  byte bVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  coord cc;
  schar unused;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (((youmonst.data)->mflags1 & 0x2000) == 0) {
    if ((u.utrap == 0) || (u.utraptype != 1)) {
      bVar11 = true;
      if (dz != -2 && (dy != -2 && dx != -2)) {
        cVar3 = u.ux + (char)dx;
        bVar6 = u.uy + (char)dy;
        uStack_38._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
        uStack_38._0_7_ = CONCAT16(bVar6,CONCAT15(cVar3,(int5)in_RAX));
        bVar11 = 0x14 < bVar6 || (byte)(cVar3 + 0xb0U) < 0xb1;
      }
      if (bVar11) {
        iVar5 = get_adjacent_loc((char *)0x0,(char *)0x0,u.ux,u.uy,(coord *)((long)&uStack_38 + 5),
                                 (schar *)((long)&uStack_38 + 7));
        if (iVar5 == 0) {
          return 0;
        }
        if (bVar11) {
          dx = (int)uStack_38._5_1_ - (int)u.ux;
          dy = (int)uStack_38._6_1_ - (int)u.uy;
          dz = 0;
        }
      }
      if ((uStack_38._5_1_ == u.ux) && (uStack_38._6_1_ == u.uy)) {
        return 0;
      }
      lVar8 = (long)(int)uStack_38._5_1_;
      lVar9 = (long)uStack_38._6_1_;
      pmVar2 = level->monsters[lVar8][lVar9];
      mtmp = (monst *)0x0;
      if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
        mtmp = pmVar2;
      }
      if ((((mtmp != (monst *)0x0) && (mtmp->m_ap_type == '\x01')) &&
          ((mtmp->mappearance == 0x1c || (mtmp->mappearance == 0x1b)))) &&
         ((u.uprops[0x17].intrinsic == 0 && (u.uprops[0x17].extrinsic == 0)))) {
        stumble_onto_mimic(mtmp,uStack_38._5_1_ - u.ux,uStack_38._6_1_ - u.uy);
        return 1;
      }
      if (level->locations[lVar8][lVar9].typ == '\x17') {
        pcVar10 = level->levname + lVar9 * 0xc + lVar8 * 0xfc;
        iVar5 = (int)pcVar10 + 0x40;
        uVar1 = *(uint *)(pcVar10 + 0x46);
        uVar7 = uVar1 >> 4 & 0x1f;
        if (uVar7 == 2) {
          iVar5 = doclose(dx,dy,dz);
          return iVar5;
        }
        if ((uVar1 & 0x40) == 0) {
          bVar6 = 1;
          if (uVar7 == 2) {
            pcVar10 = " is already open";
          }
          else if (uVar7 == 1) {
            pcVar10 = " is broken";
          }
          else if (uVar7 == 0) {
            pcVar10 = "way has no door";
          }
          else {
            *(uint *)(pcVar10 + 0x46) = uVar1 | 1;
            map_background(uStack_38._5_1_,uStack_38._6_1_,1);
            pcVar10 = " is locked";
            bVar6 = 0;
          }
          pline("This door%s.",pcVar10);
          if ((((u.uprops[0x1e].intrinsic != 0) ||
               ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
             ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
            feel_location(uStack_38._5_1_,uStack_38._6_1_);
          }
          if (!(bool)(bVar6 | flags.run != 0)) {
            bVar11 = true;
            if ((flags.autounlock != '\0') &&
               (((pick = carrying(0xe2), pick != (obj *)0x0 ||
                 (pick = carrying(0xe3), pick != (obj *)0x0)) ||
                (pick = carrying(0xe4), pick != (obj *)0x0)))) {
              bVar11 = false;
              iVar5 = pick_lock(pick,(int)uStack_38._5_1_,(int)uStack_38._6_1_,'\x01','\0');
            }
            if (!bVar11) {
              return iVar5;
            }
          }
          return 0;
        }
        if ((youmonst.data)->msize != '\0') {
          pline("The door opens.");
          if ((*(uint *)(pcVar10 + 0x46) >> 8 & 1) == 0) {
            *(uint *)(pcVar10 + 0x46) = *(uint *)(pcVar10 + 0x46) & 0xfffffe0f | 0x20;
          }
          else {
            b_trapped("door",3);
            *(uint *)(pcVar10 + 0x46) = *(uint *)(pcVar10 + 0x46) & 0xfffffe0f;
            pcVar10 = in_rooms(level,uStack_38._5_1_,uStack_38._6_1_,0x12);
            if (*pcVar10 != '\0') {
              add_damage(uStack_38._5_1_,uStack_38._6_1_,0);
            }
          }
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            newsym((int)uStack_38._5_1_,(int)uStack_38._6_1_);
          }
          else {
            feel_location(uStack_38._5_1_,uStack_38._6_1_);
          }
          unblock_point((int)uStack_38._5_1_,(int)uStack_38._6_1_);
          return 1;
        }
        pcVar10 = "You\'re too small to pull the door open.";
      }
      else {
        bVar4 = is_db_wall((int)uStack_38._5_1_,(int)uStack_38._6_1_);
        if (bVar4 == '\0') {
          if ((u.uprops[0x1e].intrinsic == 0) &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
            pcVar10 = "see";
          }
          else if (ublindf == (obj *)0x0) {
            pcVar10 = "feel";
          }
          else {
            pcVar10 = "feel";
            if (ublindf->oartifact == '\x1d') {
              pcVar10 = "see";
            }
          }
          pline("You %s no door there.",pcVar10);
          return 0;
        }
        pcVar10 = "There is no obvious way to open the drawbridge.";
      }
    }
    else {
      pcVar10 = "You can\'t reach over the edge of the pit.";
    }
  }
  else {
    pcVar10 = "You can\'t open, close, or unlock anything -- you have no hands!";
  }
  pline(pcVar10);
  return 0;
}

Assistant:

int doopen(int dx, int dy, int dz)
{
	coord cc;
	struct rm *door;
	struct monst *mtmp;
	boolean got_dir = FALSE;
	schar unused;

	if (nohands(youmonst.data)) {
	    pline("You can't open, close, or unlock anything -- you have no hands!");
	    return 0;
	}

	if (u.utrap && u.utraptype == TT_PIT) {
	    pline("You can't reach over the edge of the pit.");
	    return 0;
	}
	
	if (dx != -2 && dy != -2 && dz != -2) { /* -2 signals no direction given  */
	    cc.x = u.ux + dx;
	    cc.y = u.uy + dy;
	    if (isok(cc.x, cc.y))
		got_dir = TRUE;
	}

	if (!got_dir && !get_adjacent_loc(NULL, NULL, u.ux, u.uy, &cc, &unused))
	    return 0;

        if (!got_dir) {
            dx = cc.x-u.ux;
            dy = cc.y-u.uy;
            dz = 0;
        }

	if ((cc.x == u.ux) && (cc.y == u.uy))
	    return 0;

	if ((mtmp = m_at(level, cc.x,cc.y))		&&
		mtmp->m_ap_type == M_AP_FURNITURE	&&
		(mtmp->mappearance == S_hcdoor ||
			mtmp->mappearance == S_vcdoor)	&&
		!Protection_from_shape_changers)	 {

	    stumble_onto_mimic(mtmp, cc.x-u.ux, cc.y-u.uy);
	    return 1;
	}

	door = &level->locations[cc.x][cc.y];

	if (!IS_DOOR(door->typ)) {
		if (is_db_wall(cc.x,cc.y)) {
		    pline("There is no obvious way to open the drawbridge.");
		    return 0;
		}
		pline("You %s no door there.",
				Blind ? "feel" : "see");
		return 0;
	}

        if (door->doormask == D_ISOPEN)
            return doclose(dx, dy, dz);

	if (!(door->doormask & D_CLOSED)) {
	    const char *mesg;
	    int locked = FALSE;

	    switch (door->doormask) {
	    case D_BROKEN: mesg = " is broken"; break;
	    case D_NODOOR: mesg = "way has no door"; break;
	    case D_ISOPEN: mesg = " is already open"; break;
	    default:
		door->mem_door_l = 1;
		map_background(cc.x, cc.y, TRUE);
		mesg = " is locked";
		locked = TRUE;
		break;
	    }
	    pline("This door%s.", mesg);
	    if (Blind) feel_location(cc.x,cc.y);
	    if (locked && !flags.run) {
		struct obj *otmp = NULL;
		if (flags.autounlock &&
		    ((otmp = carrying(SKELETON_KEY)) ||
		     (otmp = carrying(LOCK_PICK)) ||
		     (otmp = carrying(CREDIT_CARD))))
		    return pick_lock(otmp, cc.x, cc.y, TRUE, FALSE);
	    }
	    return 0;
	}

	if (verysmall(youmonst.data)) {
	    pline("You're too small to pull the door open.");
	    return 0;
	}

	/* door is known to be CLOSED */
	pline("The door opens.");
	if (door->doormask & D_TRAPPED) {
	    b_trapped("door", FINGER);
	    door->doormask = D_NODOOR;
	    if (*in_rooms(level, cc.x, cc.y, SHOPBASE)) add_damage(cc.x, cc.y, 0L);
	} else
	    door->doormask = D_ISOPEN;
	if (Blind)
	    feel_location(cc.x,cc.y);	/* the hero knows she opened it  */
	else
	    newsym(cc.x,cc.y);
	unblock_point(cc.x,cc.y);	/* vision: new see through there */

	return 1;
}